

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O2

void save_component_to_files
               (TRIPLEBYTES **mrx,BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,int component,
               char *filename)

{
  undefined1 auVar1 [16];
  u_char uVar2;
  TRIPLERGB **matrix;
  ulong uVar3;
  TRIPLERGB *pTVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  uchar *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar6 = (long)(int)bmInfo.biHeight * 8;
  if ((long)(int)bmInfo.biHeight < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  matrix = (TRIPLERGB **)operator_new__(uVar6);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)bmInfo.biWidth;
  uVar6 = SUB168(auVar1 * ZEXT816(3),0);
  if (SUB168(auVar1 * ZEXT816(3),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  uVar9 = 0;
  uVar5 = 0;
  if (0 < (int)bmInfo.biWidth) {
    uVar5 = (ulong)bmInfo.biWidth;
  }
  uVar3 = 0;
  if (0 < (int)bmInfo.biHeight) {
    uVar3 = (ulong)bmInfo.biHeight;
  }
  for (; uVar9 != uVar3; uVar9 = uVar9 + 1) {
    pTVar4 = (TRIPLERGB *)operator_new__(uVar6);
    matrix[uVar9] = pTVar4;
    puVar7 = &pTVar4->red;
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      uVar2 = getComponent(mrx,(int)uVar9,(int)uVar8,component);
      ((TRIPLERGB *)(puVar7 + -2))->blue = uVar2;
      puVar7[-1] = uVar2;
      *puVar7 = uVar2;
      puVar7 = puVar7 + 3;
    }
  }
  saveBMPFile(bmFile,bmInfo,matrix,filename);
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    if (matrix[uVar6] != (TRIPLERGB *)0x0) {
      operator_delete__(matrix[uVar6]);
    }
  }
  operator_delete__(matrix);
  return;
}

Assistant:

void save_component_to_files(TRIPLEBYTES **mrx, BITMAPFILEHEADER bmFile, BITMAPINFOHEADER bmInfo, int component,
                             const char *filename) {
    int height = bmInfo.biHeight;
    int width = bmInfo.biWidth;
    TRIPLERGB **mrxComponent = new TRIPLERGB *[height];
    for (int i = 0; i < height; i++) {
        mrxComponent[i] = new TRIPLERGB[width];
        for (int j = 0; j < width; j++) {
            mrxComponent[i][j].red = mrxComponent[i][j].green = mrxComponent[i][j].blue = getComponent(mrx, i, j,
                                                                                                       component);
        }
    }
    saveBMPFile(bmFile, bmInfo, mrxComponent, filename);
    for (int i = 0; i < height; i++) {
        delete[] mrxComponent[i];
    }
    delete[] mrxComponent;
}